

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseContentInternal(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlChar xVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int int1;
  int *piVar7;
  xmlParserInputPtr pxVar8;
  xmlNodePtr pxVar9;
  xmlChar *pxVar10;
  int *piVar11;
  uint uVar12;
  
  iVar3 = ctxt->nameNr;
  iVar4 = ctxt->spaceNr;
  iVar5 = ctxt->nodeNr;
  pxVar8 = ctxt->input;
  if ((pxVar8->flags & 0x40) != 0) goto LAB_0013cdc0;
  do {
    if ((long)pxVar8->end - (long)pxVar8->cur < 0xfa) {
      xmlParserGrow(ctxt);
      pxVar8 = ctxt->input;
    }
LAB_0013cdc0:
    do {
      pxVar10 = pxVar8->cur;
      if ((pxVar8->end <= pxVar10) || (1 < ctxt->disableSAX)) {
LAB_0013ceb1:
        iVar6 = ctxt->nameNr;
        if (((iVar3 < iVar6) && (pxVar8->end <= pxVar8->cur)) && (ctxt->wellFormed != 0)) {
          int1 = ctxt->pushTab[(long)iVar6 + -1].line;
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_TAG_NOT_FINISHED,XML_ERR_FATAL,
                     ctxt->nameTab[(long)iVar6 + -1],(xmlChar *)0x0,(xmlChar *)0x0,int1,
                     "Premature end of data in tag %s line %d\n",ctxt->nameTab[(long)iVar6 + -1],
                     int1,0);
        }
        uVar12 = ctxt->nodeNr;
        while (iVar5 < (int)uVar12) {
          if (0 < (int)uVar12) {
            uVar1 = uVar12 - 1;
            ctxt->nodeNr = uVar1;
            if (uVar12 == 1) {
              pxVar9 = (xmlNodePtr)0x0;
            }
            else {
              pxVar9 = ctxt->nodeTab[(ulong)uVar12 - 2];
            }
            ctxt->node = pxVar9;
            ctxt->nodeTab[uVar1] = (xmlNodePtr)0x0;
            uVar12 = uVar1;
          }
        }
        uVar12 = ctxt->nameNr;
        while (iVar3 < (int)uVar12) {
          iVar5 = ctxt->pushTab[(long)(int)uVar12 + -1].nsNr;
          if (iVar5 != 0) {
            xmlParserNsPop(ctxt,iVar5);
            uVar12 = ctxt->nameNr;
          }
          if (0 < (int)uVar12) {
            uVar1 = uVar12 - 1;
            ctxt->nameNr = uVar1;
            if (uVar12 == 1) {
              pxVar10 = (xmlChar *)0x0;
            }
            else {
              pxVar10 = ctxt->nameTab[(ulong)uVar12 - 2];
            }
            ctxt->name = pxVar10;
            ctxt->nameTab[uVar1] = (xmlChar *)0x0;
            uVar12 = uVar1;
          }
        }
        do {
          uVar12 = ctxt->spaceNr;
          do {
            if ((int)uVar12 <= iVar4) {
              return;
            }
          } while ((int)uVar12 < 1);
          ctxt->spaceNr = uVar12 - 1;
          piVar7 = ctxt->spaceTab;
          piVar11 = piVar7 + ((ulong)uVar12 - 2);
          if (uVar12 == 1) {
            piVar11 = piVar7;
          }
          ctxt->space = piVar11;
          piVar7[uVar12 - 1] = -1;
        } while( true );
      }
      if (*pxVar10 == '&') {
        xmlParseReference(ctxt);
      }
      else if (*pxVar10 == '<') {
        xVar2 = pxVar10[1];
        if (xVar2 == '!') {
          if ((((pxVar10[2] == '[') && (pxVar10[3] == 'C')) && (pxVar10[4] == 'D')) &&
             (((pxVar10[5] == 'A' && (pxVar10[6] == 'T')) &&
              ((pxVar10[7] == 'A' && (pxVar10[8] == '[')))))) {
            xmlParseCDSect(ctxt);
          }
          else {
            if ((pxVar10[2] != '-') || (pxVar10[3] != '-')) goto LAB_0013ce80;
            xmlParseComment(ctxt);
          }
        }
        else if (xVar2 == '/') {
          if (ctxt->nameNr <= iVar3) goto LAB_0013ceb1;
          xmlParseElementEnd(ctxt);
        }
        else if (xVar2 == '?') {
          xmlParsePI(ctxt);
        }
        else {
LAB_0013ce80:
          xmlParseElementStart(ctxt);
        }
      }
      else {
        xmlParseCharDataInternal(ctxt,0);
      }
      pxVar8 = ctxt->input;
      uVar12 = pxVar8->flags;
      if ((uVar12 & 0x40) == 0) {
        xmlParserShrink(ctxt);
        pxVar8 = ctxt->input;
        uVar12 = pxVar8->flags;
      }
    } while ((uVar12 & 0x40) != 0);
  } while( true );
}

Assistant:

static void
xmlParseContentInternal(xmlParserCtxtPtr ctxt) {
    int oldNameNr = ctxt->nameNr;
    int oldSpaceNr = ctxt->spaceNr;
    int oldNodeNr = ctxt->nodeNr;

    GROW;
    while ((ctxt->input->cur < ctxt->input->end) &&
	   (PARSER_STOPPED(ctxt) == 0)) {
	const xmlChar *cur = ctxt->input->cur;

	/*
	 * First case : a Processing Instruction.
	 */
	if ((*cur == '<') && (cur[1] == '?')) {
	    xmlParsePI(ctxt);
	}

	/*
	 * Second case : a CDSection
	 */
	/* 2.6.0 test was *cur not RAW */
	else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	    xmlParseCDSect(ctxt);
	}

	/*
	 * Third case :  a comment
	 */
	else if ((*cur == '<') && (NXT(1) == '!') &&
		 (NXT(2) == '-') && (NXT(3) == '-')) {
	    xmlParseComment(ctxt);
	}

	/*
	 * Fourth case :  a sub-element.
	 */
	else if (*cur == '<') {
            if (NXT(1) == '/') {
                if (ctxt->nameNr <= oldNameNr)
                    break;
	        xmlParseElementEnd(ctxt);
            } else {
	        xmlParseElementStart(ctxt);
            }
	}

	/*
	 * Fifth case : a reference. If if has not been resolved,
	 *    parsing returns it's Name, create the node
	 */

	else if (*cur == '&') {
	    xmlParseReference(ctxt);
	}

	/*
	 * Last case, text. Note that References are handled directly.
	 */
	else {
	    xmlParseCharDataInternal(ctxt, 0);
	}

	SHRINK;
	GROW;
    }

    if ((ctxt->nameNr > oldNameNr) &&
        (ctxt->input->cur >= ctxt->input->end) &&
        (ctxt->wellFormed)) {
        const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
        int line = ctxt->pushTab[ctxt->nameNr - 1].line;
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                "Premature end of data in tag %s line %d\n",
                name, line, NULL);
    }

    /*
     * Clean up in error case
     */

    while (ctxt->nodeNr > oldNodeNr)
        nodePop(ctxt);

    while (ctxt->nameNr > oldNameNr) {
        xmlStartTag *tag = &ctxt->pushTab[ctxt->nameNr - 1];

        if (tag->nsNr != 0)
            xmlParserNsPop(ctxt, tag->nsNr);

        namePop(ctxt);
    }

    while (ctxt->spaceNr > oldSpaceNr)
        spacePop(ctxt);
}